

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

void __thiscall Liby::EventLoopGroup::worker_thread(EventLoopGroup *this,int index)

{
  EventLoop *this_00;
  pointer ppEVar1;
  EventLoop *pEVar2;
  pointer ppEVar3;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if ((-1 < index) && (index <= this->n_)) {
    this_00 = (this->loops_).
              super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(uint)index].
              super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pEVar2 = EventLoop::curr_thread_loop();
    if (pEVar2 == (EventLoop *)0x0) {
      EventLoop::bind_to_thread(this_00);
    }
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<Liby::EventLoop_*(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:45:26)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<Liby::EventLoop_*(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:45:26)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    std::function<Liby::EventLoop_*(int)>::operator=
              (&this_00->rf_,(function<Liby::EventLoop_*(int)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<Liby::EventLoop_*(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:46:27)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<Liby::EventLoop_*(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:46:27)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    std::function<Liby::EventLoop_*(int)>::operator=
              (&this_00->rf1_,(function<Liby::EventLoop_*(int)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:48:14)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:48:14)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    EventLoop::run(this_00,(BoolFunctor *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    ppEVar1 = (this->ploops_).
              super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar3 = (this->ploops_).
                   super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppEVar3 != ppEVar1; ppEVar3 = ppEVar3 + 1) {
      EventLoop::wakeup(*ppEVar3);
    }
    return;
  }
  __assert_fail("index >= 0 && index <= n_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp"
                ,0x26,"void Liby::EventLoopGroup::worker_thread(int)");
}

Assistant:

void EventLoopGroup::worker_thread(int index) {
    assert(index >= 0 && index <= n_);

    EventLoop &loop = *loops_[index];

    if (loop.curr_thread_loop() == nullptr)
        loop.bind_to_thread();

    loop.setRobinFunctor([this](int fd) { return robinLoop(fd); });
    loop.setRobinFunctor1([this](int fd) { return robinLoop1(fd); });

    loop.run([this] {
        static std::mutex m;
        std::lock_guard<std::mutex> G_(m);
        return bf_();
    });

    // 这里不用担心调用wakeup时EventLoopGroup被析构
    //　因为主线程的析构函数会等待其他线程终结

    for (auto loop : ploops_) {
        loop->wakeup();
    }
}